

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

uint8_t * assembler::anon_unknown_0::get_address_8bit
                    (operand oper,uint64_t operand_mem,registers *regs)

{
  uint8_t *puVar1;
  
  puVar1 = (uint8_t *)0x0;
  switch(oper) {
  case AL:
    return (uint8_t *)regs;
  case AH:
    return (uint8_t *)((long)&regs->rax + 1);
  case BL:
    return (uint8_t *)&regs->rbx;
  case BH:
    return (uint8_t *)((long)&regs->rbx + 1);
  case CL:
    return (uint8_t *)&regs->rcx;
  case CH:
    return (uint8_t *)((long)&regs->rcx + 1);
  case DL:
    return (uint8_t *)&regs->rdx;
  case DH:
    return (uint8_t *)((long)&regs->rdx + 1);
  case BYTE_MEM_RAX:
    puVar1 = (uint8_t *)(operand_mem + regs->rax);
    break;
  case BYTE_MEM_RBX:
    puVar1 = (uint8_t *)(operand_mem + regs->rbx);
    break;
  case BYTE_MEM_RCX:
    puVar1 = (uint8_t *)(operand_mem + regs->rcx);
    break;
  case BYTE_MEM_RDX:
    puVar1 = (uint8_t *)(operand_mem + regs->rdx);
    break;
  case BYTE_MEM_RDI:
    puVar1 = (uint8_t *)(operand_mem + regs->rdi);
    break;
  case BYTE_MEM_RSI:
    puVar1 = (uint8_t *)(operand_mem + regs->rsi);
    break;
  case BYTE_MEM_RSP:
    puVar1 = (uint8_t *)(operand_mem + regs->rsp);
    break;
  case BYTE_MEM_RBP:
    puVar1 = (uint8_t *)(operand_mem + regs->rbp);
    break;
  case BYTE_MEM_R8:
    puVar1 = (uint8_t *)(operand_mem + regs->r8);
    break;
  case BYTE_MEM_R9:
    puVar1 = (uint8_t *)(operand_mem + regs->r9);
    break;
  case BYTE_MEM_R10:
    puVar1 = (uint8_t *)(operand_mem + regs->r10);
    break;
  case BYTE_MEM_R11:
    puVar1 = (uint8_t *)(operand_mem + regs->r11);
    break;
  case BYTE_MEM_R12:
    puVar1 = (uint8_t *)(operand_mem + regs->r12);
    break;
  case BYTE_MEM_R13:
    puVar1 = (uint8_t *)(operand_mem + regs->r13);
    break;
  case BYTE_MEM_R14:
    puVar1 = (uint8_t *)(operand_mem + regs->r14);
    break;
  case BYTE_MEM_R15:
    puVar1 = (uint8_t *)(operand_mem + regs->r15);
  }
  return puVar1;
}

Assistant:

uint8_t* get_address_8bit(asmcode::operand oper, uint64_t operand_mem, registers& regs)
    {
    switch (oper)
      {
      case asmcode::EMPTY: return nullptr;
      case asmcode::AL: return (uint8_t*)&regs.rax;
      case asmcode::AH: return (uint8_t*)(((uint8_t*)(&regs.rax)) + 1);
      case asmcode::BL: return (uint8_t*)&regs.rbx;
      case asmcode::BH: return (uint8_t*)(((uint8_t*)(&regs.rbx)) + 1);
      case asmcode::CL: return (uint8_t*)&regs.rcx;
      case asmcode::CH: return (uint8_t*)(((uint8_t*)(&regs.rcx)) + 1);
      case asmcode::DL: return (uint8_t*)&regs.rdx;
      case asmcode::DH: return (uint8_t*)(((uint8_t*)(&regs.rdx)) + 1);
      case asmcode::RAX: return nullptr;
      case asmcode::RBX: return nullptr;
      case asmcode::RCX: return nullptr;
      case asmcode::RDX: return nullptr;
      case asmcode::RDI: return nullptr;
      case asmcode::RSI: return nullptr;
      case asmcode::RSP: return nullptr;
      case asmcode::RBP: return nullptr;
      case asmcode::R8:  return nullptr;
      case asmcode::R9:  return nullptr;
      case asmcode::R10: return nullptr;
      case asmcode::R11: return nullptr;
      case asmcode::R12: return nullptr;
      case asmcode::R13: return nullptr;
      case asmcode::R14: return nullptr;
      case asmcode::R15: return nullptr;
      case asmcode::MEM_RAX: return nullptr;
      case asmcode::MEM_RBX: return nullptr;
      case asmcode::MEM_RCX: return nullptr;
      case asmcode::MEM_RDX: return nullptr;
      case asmcode::MEM_RDI: return nullptr;
      case asmcode::MEM_RSI: return nullptr;
      case asmcode::MEM_RSP: return nullptr;
      case asmcode::MEM_RBP: return nullptr;
      case asmcode::MEM_R8:  return nullptr;
      case asmcode::MEM_R9:  return nullptr;
      case asmcode::MEM_R10: return nullptr;
      case asmcode::MEM_R11: return nullptr;
      case asmcode::MEM_R12: return nullptr;
      case asmcode::MEM_R13: return nullptr;
      case asmcode::MEM_R14: return nullptr;
      case asmcode::MEM_R15: return nullptr;
      case asmcode::BYTE_MEM_RAX: return (uint8_t*)(regs.rax + operand_mem);
      case asmcode::BYTE_MEM_RBX: return (uint8_t*)(regs.rbx + operand_mem);
      case asmcode::BYTE_MEM_RCX: return (uint8_t*)(regs.rcx + operand_mem);
      case asmcode::BYTE_MEM_RDX: return (uint8_t*)(regs.rdx + operand_mem);
      case asmcode::BYTE_MEM_RDI: return (uint8_t*)(regs.rdi + operand_mem);
      case asmcode::BYTE_MEM_RSI: return (uint8_t*)(regs.rsi + operand_mem);
      case asmcode::BYTE_MEM_RSP: return (uint8_t*)(regs.rsp + operand_mem);
      case asmcode::BYTE_MEM_RBP: return (uint8_t*)(regs.rbp + operand_mem);
      case asmcode::BYTE_MEM_R8:  return (uint8_t*)(regs.r8 + operand_mem);
      case asmcode::BYTE_MEM_R9:  return (uint8_t*)(regs.r9 + operand_mem);
      case asmcode::BYTE_MEM_R10: return (uint8_t*)(regs.r10 + operand_mem);
      case asmcode::BYTE_MEM_R11: return (uint8_t*)(regs.r11 + operand_mem);
      case asmcode::BYTE_MEM_R12: return (uint8_t*)(regs.r12 + operand_mem);
      case asmcode::BYTE_MEM_R13: return (uint8_t*)(regs.r13 + operand_mem);
      case asmcode::BYTE_MEM_R14: return (uint8_t*)(regs.r14 + operand_mem);
      case asmcode::BYTE_MEM_R15: return (uint8_t*)(regs.r15 + operand_mem);
      case asmcode::NUMBER: return nullptr;
      case asmcode::ST0:  return nullptr;
      case asmcode::ST1:  return nullptr;
      case asmcode::ST2:  return nullptr;
      case asmcode::ST3:  return nullptr;
      case asmcode::ST4:  return nullptr;
      case asmcode::ST5:  return nullptr;
      case asmcode::ST6:  return nullptr;
      case asmcode::ST7:  return nullptr;
      case asmcode::XMM0: return nullptr;
      case asmcode::XMM1: return nullptr;
      case asmcode::XMM2: return nullptr;
      case asmcode::XMM3: return nullptr;
      case asmcode::XMM4: return nullptr;
      case asmcode::XMM5: return nullptr;
      case asmcode::XMM6: return nullptr;
      case asmcode::XMM7: return nullptr;
      case asmcode::XMM8: return nullptr;
      case asmcode::XMM9: return nullptr;
      case asmcode::XMM10:return nullptr;
      case asmcode::XMM11:return nullptr;
      case asmcode::XMM12:return nullptr;
      case asmcode::XMM13:return nullptr;
      case asmcode::XMM14:return nullptr;
      case asmcode::XMM15:return nullptr;
      case asmcode::LABELADDRESS: return nullptr;
      default: return nullptr;
      }
    }